

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O2

ssize_t tnt_object_vformat(tnt_stream *s,char *fmt,__va_list_tag *vl)

{
  char cVar1;
  uint uVar2;
  char *__s;
  uint32_t *puVar3;
  long lVar4;
  int *piVar5;
  undefined8 *puVar6;
  uint *puVar7;
  double *pdVar8;
  size_t sVar9;
  uint64_t *puVar10;
  int64_t *piVar11;
  ulong uVar12;
  uint32_t len;
  long lVar13;
  int64_t value;
  uint64_t value_00;
  char *pcVar14;
  
  if (s->wrcnt != 0) {
    return -1;
  }
  *(undefined4 *)(*(long *)((long)s->data + 0x30) + 0xc) = 2;
  lVar13 = 0;
  do {
    cVar1 = *fmt;
    if (cVar1 != '%') {
      pcVar14 = fmt;
      if (cVar1 == 'N') {
        if ((fmt[1] != 'I') || (fmt[2] != 'L')) goto LAB_00103eb3;
        lVar4 = tnt_object_add_nil(s);
        if (lVar4 == -1) {
          return -1;
        }
        fmt = fmt + 2;
      }
      else {
        if (cVar1 == '[') {
          lVar4 = tnt_object_add_array(s,0);
        }
        else {
          if (cVar1 != ']') {
            if (cVar1 == '{') {
              lVar4 = tnt_object_add_map(s,0);
              goto LAB_00103ea6;
            }
            if (cVar1 != '}') {
              if (cVar1 == '\0') {
                return lVar13;
              }
              goto LAB_00103eb3;
            }
          }
          lVar4 = tnt_object_container_close(s);
        }
LAB_00103ea6:
        if (lVar4 == -1) {
          return -1;
        }
      }
LAB_00103eb0:
      lVar13 = lVar13 + lVar4;
      pcVar14 = fmt;
      goto LAB_00103eb3;
    }
    pcVar14 = fmt + 1;
    cVar1 = fmt[1];
    switch(cVar1) {
    case 'b':
      uVar2 = vl->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        piVar5 = (int *)((ulong)uVar2 + (long)vl->reg_save_area);
        vl->gp_offset = uVar2 + 8;
      }
      else {
        piVar5 = (int *)vl->overflow_arg_area;
        vl->overflow_arg_area = piVar5 + 2;
      }
      lVar4 = tnt_object_add_bool(s,*piVar5 != 0);
      break;
    case 'c':
    case 'e':
    case 'g':
    case 'j':
    case 'k':
    case 'm':
    case 'n':
    case 'o':
    case 'p':
    case 'q':
    case 'r':
    case 't':
switchD_00103f01_caseD_63:
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/tnt/tnt_object.c"
                    ,0x1a3,
                    "ssize_t tnt_object_vformat(struct tnt_stream *, const char *, struct __va_list_tag *)"
                   );
    case 'd':
    case 'i':
      goto switchD_00103f01_caseD_64;
    case 'f':
      uVar2 = vl->fp_offset;
      if ((ulong)uVar2 < 0xa1) {
        pdVar8 = (double *)((ulong)uVar2 + (long)vl->reg_save_area);
        vl->fp_offset = uVar2 + 0x10;
      }
      else {
        pdVar8 = (double *)vl->overflow_arg_area;
        vl->overflow_arg_area = pdVar8 + 1;
      }
      lVar4 = tnt_object_add_float(s,(float)*pdVar8);
      break;
    case 'h':
      pcVar14 = fmt + 2;
      cVar1 = fmt[2];
      if (cVar1 != 'd') {
        if (cVar1 == 'h') {
          if ((fmt[3] != 'i') && (fmt[3] != 'd')) {
            if (fmt[3] != 'u') goto switchD_00103f01_caseD_63;
            uVar2 = vl->gp_offset;
            if ((ulong)uVar2 < 0x29) {
              puVar7 = (uint *)((ulong)uVar2 + (long)vl->reg_save_area);
              vl->gp_offset = uVar2 + 8;
            }
            else {
              puVar7 = (uint *)vl->overflow_arg_area;
              vl->overflow_arg_area = puVar7 + 2;
            }
            value_00 = (uint64_t)*puVar7;
            goto LAB_001042d5;
          }
          uVar2 = vl->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            piVar5 = (int *)((ulong)uVar2 + (long)vl->reg_save_area);
            vl->gp_offset = uVar2 + 8;
          }
          else {
            piVar5 = (int *)vl->overflow_arg_area;
            vl->overflow_arg_area = piVar5 + 2;
          }
          value = (int64_t)*piVar5;
LAB_00104286:
          pcVar14 = fmt + 3;
          goto LAB_00103f8a;
        }
        if (cVar1 == 'u') goto switchD_00103f01_caseD_75;
        if (cVar1 != 'i') goto switchD_00103f01_caseD_63;
      }
      goto switchD_00103f01_caseD_64;
    case 'l':
      pcVar14 = fmt + 2;
      switch(fmt[2]) {
      case 'd':
      case 'i':
        uVar2 = vl->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          piVar11 = (int64_t *)((ulong)uVar2 + (long)vl->reg_save_area);
          vl->gp_offset = uVar2 + 8;
        }
        else {
          piVar11 = (int64_t *)vl->overflow_arg_area;
          vl->overflow_arg_area = piVar11 + 1;
        }
        value = *piVar11;
        goto LAB_00103f8a;
      case 'e':
      case 'g':
      case 'h':
      case 'j':
      case 'k':
        goto switchD_00103f01_caseD_63;
      case 'f':
        uVar2 = vl->fp_offset;
        if ((ulong)uVar2 < 0xa1) {
          pdVar8 = (double *)((ulong)uVar2 + (long)vl->reg_save_area);
          vl->fp_offset = uVar2 + 0x10;
        }
        else {
          pdVar8 = (double *)vl->overflow_arg_area;
          vl->overflow_arg_area = pdVar8 + 1;
        }
        lVar4 = tnt_object_add_double(s,*pdVar8);
        goto LAB_001040fd;
      case 'l':
        if ((fmt[3] == 'i') || (fmt[3] == 'd')) {
          uVar2 = vl->gp_offset;
          if ((ulong)uVar2 < 0x29) {
            piVar11 = (int64_t *)((ulong)uVar2 + (long)vl->reg_save_area);
            vl->gp_offset = uVar2 + 8;
          }
          else {
            piVar11 = (int64_t *)vl->overflow_arg_area;
            vl->overflow_arg_area = piVar11 + 1;
          }
          value = *piVar11;
          goto LAB_00104286;
        }
        if (fmt[3] != 'u') goto switchD_00103f01_caseD_63;
        uVar2 = vl->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar10 = (uint64_t *)((ulong)uVar2 + (long)vl->reg_save_area);
          vl->gp_offset = uVar2 + 8;
        }
        else {
          puVar10 = (uint64_t *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar10 + 1;
        }
        value_00 = *puVar10;
LAB_001042d5:
        pcVar14 = fmt + 3;
        break;
      default:
        if (fmt[2] != 'u') goto switchD_00103f01_caseD_63;
        uVar2 = vl->gp_offset;
        if ((ulong)uVar2 < 0x29) {
          puVar10 = (uint64_t *)((ulong)uVar2 + (long)vl->reg_save_area);
          vl->gp_offset = uVar2 + 8;
        }
        else {
          puVar10 = (uint64_t *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar10 + 1;
        }
        value_00 = *puVar10;
      }
LAB_00104080:
      lVar4 = tnt_object_add_uint(s,value_00);
      goto LAB_00104088;
    case 's':
      uVar2 = vl->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar6 = (undefined8 *)((ulong)uVar2 + (long)vl->reg_save_area);
        vl->gp_offset = uVar2 + 8;
      }
      else {
        puVar6 = (undefined8 *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar6 + 1;
      }
      __s = (char *)*puVar6;
      sVar9 = strlen(__s);
      lVar4 = tnt_object_add_str(s,__s,(uint32_t)sVar9);
      break;
    case 'u':
switchD_00103f01_caseD_75:
      uVar2 = vl->gp_offset;
      if ((ulong)uVar2 < 0x29) {
        puVar7 = (uint *)((ulong)uVar2 + (long)vl->reg_save_area);
        vl->gp_offset = uVar2 + 8;
      }
      else {
        puVar7 = (uint *)vl->overflow_arg_area;
        vl->overflow_arg_area = puVar7 + 2;
      }
      value_00 = (uint64_t)*puVar7;
      goto LAB_00104080;
    default:
      if (cVar1 != '%') {
        if (cVar1 != '.') {
          if (cVar1 == '\0') {
            __assert_fail("f[0]",
                          "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]tarantool-c/tnt/tnt_object.c"
                          ,0x156,
                          "ssize_t tnt_object_vformat(struct tnt_stream *, const char *, struct __va_list_tag *)"
                         );
          }
          goto switchD_00103f01_caseD_63;
        }
        if ((fmt[2] != '*') || (fmt[3] != 's')) goto switchD_00103f01_caseD_63;
        uVar2 = vl->gp_offset;
        uVar12 = (ulong)uVar2;
        if (uVar12 < 0x29) {
          vl->gp_offset = (uint)(uVar12 + 8);
          len = *(uint32_t *)((long)vl->reg_save_area + uVar12);
          if (0x20 < uVar2) goto LAB_00104120;
          puVar6 = (undefined8 *)(uVar12 + 8 + (long)vl->reg_save_area);
          vl->gp_offset = uVar2 + 0x10;
        }
        else {
          puVar3 = (uint32_t *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar3 + 2;
          len = *puVar3;
LAB_00104120:
          puVar6 = (undefined8 *)vl->overflow_arg_area;
          vl->overflow_arg_area = puVar6 + 1;
        }
        lVar4 = tnt_object_add_str(s,(char *)*puVar6,len);
        if (lVar4 == -1) {
          return -1;
        }
        fmt = fmt + 3;
        goto LAB_00103eb0;
      }
      goto LAB_00103eb3;
    }
LAB_001040fd:
    if (lVar4 == -1) {
      return -1;
    }
    lVar13 = lVar13 + lVar4;
LAB_00103eb3:
    fmt = pcVar14 + 1;
  } while( true );
switchD_00103f01_caseD_64:
  uVar2 = vl->gp_offset;
  if ((ulong)uVar2 < 0x29) {
    piVar5 = (int *)((ulong)uVar2 + (long)vl->reg_save_area);
    vl->gp_offset = uVar2 + 8;
  }
  else {
    piVar5 = (int *)vl->overflow_arg_area;
    vl->overflow_arg_area = piVar5 + 2;
  }
  value = (int64_t)*piVar5;
LAB_00103f8a:
  lVar4 = tnt_object_add_int(s,value);
LAB_00104088:
  if (lVar4 == -1) {
    return -1;
  }
  lVar13 = lVar13 + lVar4;
  goto LAB_00103eb3;
}

Assistant:

ssize_t tnt_object_vformat(struct tnt_stream *s, const char *fmt, va_list vl)
{
	if (tnt_object_type(s, TNT_SBO_PACKED) == -1)
		return -1;
	ssize_t result = 0, rv = 0;

	for (const char *f = fmt; *f; f++) {
		if (f[0] == '[') {
			if ((rv = tnt_object_add_array(s, 0)) == -1)
				return -1;
			result += rv;
		} else if (f[0] == '{') {
			if ((rv = tnt_object_add_map(s, 0)) == -1)
				return -1;
			result += rv;
		} else if (f[0] == ']' || f[0] == '}') {
			if ((rv = tnt_object_container_close(s)) == -1)
				return -1;
			result += rv;
		} else if (f[0] == '%') {
			f++;
			assert(f[0]);
			int64_t int_value = 0;
			int int_status = 0; /* 1 - signed, 2 - unsigned */

			if (f[0] == 'd' || f[0] == 'i') {
				int_value = va_arg(vl, int);
				int_status = 1;
			} else if (f[0] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
			} else if (f[0] == 's') {
				const char *str = va_arg(vl, const char *);
				uint32_t len = (uint32_t)strlen(str);
				if ((rv = tnt_object_add_str(s, str, len)) == -1)
					return -1;
				result += rv;
			} else if (f[0] == '.' && f[1] == '*' && f[2] == 's') {
				uint32_t len = va_arg(vl, uint32_t);
				const char *str = va_arg(vl, const char *);
				if ((rv = tnt_object_add_str(s, str, len)) == -1)
					return -1;
				result += rv;
				f += 2;
			} else if (f[0] == 'f') {
				float v = (float)va_arg(vl, double);
				if ((rv = tnt_object_add_float(s, v)) == -1)
					return -1;
				result += rv;
			} else if (f[0] == 'l' && f[1] == 'f') {
				double v = va_arg(vl, double);
				if ((rv = tnt_object_add_double(s, v)) == -1)
					return -1;
				result += rv;
				f++;
			} else if (f[0] == 'b') {
				bool v = (bool)va_arg(vl, int);
				if ((rv = tnt_object_add_bool(s, v)) == -1)
					return -1;
				result += rv;
			} else if (f[0] == 'l'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, long);
				int_status = 1;
				f++;
			} else if (f[0] == 'l' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned long);
				int_status = 2;
				f++;
			} else if (f[0] == 'l' && f[1] == 'l'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, long long);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'l' && f[1] == 'l' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned long long);
				int_status = 2;
				f += 2;
			} else if (f[0] == 'h'
				   && (f[1] == 'd' || f[1] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f++;
			} else if (f[0] == 'h' && f[1] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f++;
			} else if (f[0] == 'h' && f[1] == 'h'
				   && (f[2] == 'd' || f[2] == 'i')) {
				int_value = va_arg(vl, int);
				int_status = 1;
				f += 2;
			} else if (f[0] == 'h' && f[1] == 'h' && f[2] == 'u') {
				int_value = va_arg(vl, unsigned int);
				int_status = 2;
				f += 2;
			} else if (f[0] != '%') {
				/* unexpected format specifier */
				assert(false);
			}

			if (int_status == 1) {
				rv = tnt_object_add_int(s, int_value);
				if (rv == -1)
					return -1;
				result += rv;
			} else if (int_status == 2) {
				rv = tnt_object_add_uint(s, int_value);
				if (rv == -1)
					return -1;
				result += rv;
			}
		} else if (f[0] == 'N' && f[1] == 'I' && f[2] == 'L') {
			if ((rv = tnt_object_add_nil(s)) == -1)
				return -1;
			result += rv;
			f += 2;
		}
	}
	return result;
}